

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_register_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  byte bVar1;
  byte *pbVar2;
  kh_vdict_t *pkVar3;
  bcf_idinfo_t *pbVar4;
  int iVar5;
  int iVar6;
  khint_t kVar7;
  char *pcVar8;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int j;
  int ret;
  char *tmp;
  uint32_t local_5c;
  undefined8 local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  bcf_hdr_t *local_38;
  
  pcVar8 = hrec->key;
  iVar5 = strcmp(pcVar8,"contig");
  if (iVar5 == 0) {
    hrec->type = 3;
    uVar12 = bcf_hrec_find_key(hrec,"length");
    if ((int)uVar12 < 0) {
      local_5c = 0;
    }
    else {
      iVar5 = __isoc99_sscanf(hrec->vals[uVar12],"%d",&local_5c);
      if (iVar5 != 1) {
        return 0;
      }
    }
    uVar12 = bcf_hrec_find_key(hrec,"ID");
    if ((int)uVar12 < 0) {
      return 0;
    }
    pcVar8 = strdup(hrec->vals[uVar12]);
    pkVar3 = (kh_vdict_t *)hdr->dict[1];
    kVar7 = kh_put_vdict(pkVar3,pcVar8,&local_4c);
    if (local_4c == 0) {
      free(pcVar8);
      return 0;
    }
    iVar5 = bcf_hrec_find_key(hrec,"IDX");
    if (iVar5 == -1) {
      iVar5 = pkVar3->size - 1;
      hrec_add_idx(hrec,iVar5);
    }
    else {
      local_48 = hrec->vals[iVar5];
      lVar13 = strtol(local_48,&local_48,10);
      iVar5 = (int)lVar13;
      if (*local_48 != '\0') {
        uVar10 = 0x178;
LAB_00114a81:
        fprintf(_stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                ,uVar10,"bcf_hdr_register_hrec");
        return 0;
      }
    }
    pbVar4 = pkVar3->vals;
    pbVar4[(int)kVar7].hrec[2] = (bcf_hrec_t *)0x0;
    (pbVar4[(int)kVar7].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
    pbVar4[(int)kVar7].hrec[0] = (bcf_hrec_t *)0x0;
    pbVar4[(int)kVar7].hrec[1] = (bcf_hrec_t *)0x0;
    pbVar4 = pbVar4 + (int)kVar7;
    pbVar4->info[0] = 0xf;
    pbVar4->info[1] = 0xf;
    *(undefined8 *)(pbVar4->info + 2) = 0xf;
    pbVar4 = pkVar3->vals;
    pbVar4[(int)kVar7].id = iVar5;
    pbVar4[(int)kVar7].info[0] = local_5c;
    pbVar4[(int)kVar7].hrec[0] = hrec;
LAB_00114a45:
    iVar5 = 1;
  }
  else {
    iVar5 = strcmp(pcVar8,"INFO");
    if (iVar5 == 0) {
      iVar5 = 1;
LAB_00114657:
      hrec->type = iVar5;
      local_5c = 0xffffffff;
      if (0 < hrec->nkeys) {
        lVar13 = 0xffffffff;
        lVar11 = 0;
        local_58 = CONCAT44(local_58._4_4_,0xffffffff);
        iVar5 = -1;
        local_40 = (char *)0x0;
        local_38 = hdr;
        do {
          pcVar8 = hrec->keys[lVar11];
          if (((*pcVar8 == 'I') && (pcVar8[1] == 'D')) && (pcVar8[2] == '\0')) {
            local_40 = hrec->vals[lVar11];
          }
          else {
            iVar6 = strcmp(pcVar8,"IDX");
            if (iVar6 == 0) {
              local_48 = hrec->vals[lVar11];
              lVar13 = strtol(local_48,&local_48,10);
              if (*local_48 != '\0') {
                uVar10 = 0x19c;
                goto LAB_00114a81;
              }
            }
            else {
              iVar6 = strcmp(pcVar8,"Type");
              if (iVar6 == 0) {
                pcVar8 = hrec->vals[lVar11];
                iVar5 = strcmp(pcVar8,"Integer");
                if (iVar5 == 0) {
                  iVar5 = 1;
                }
                else {
                  iVar5 = strcmp(pcVar8,"Float");
                  if (iVar5 == 0) {
                    iVar5 = 2;
                  }
                  else {
                    iVar6 = strcmp(pcVar8,"String");
                    iVar5 = 3;
                    if ((iVar6 != 0) && (iVar6 = strcmp(pcVar8,"Character"), iVar6 != 0)) {
                      iVar6 = strcmp(pcVar8,"Flag");
                      if (iVar6 == 0) {
                        iVar5 = 0;
                      }
                      else {
                        fprintf(_stderr,
                                "[E::%s] The type \"%s\" not supported, assuming \"String\"\n",
                                "bcf_hdr_register_hrec",pcVar8);
                      }
                    }
                  }
                }
              }
              else {
                iVar6 = strcmp(pcVar8,"Number");
                if (iVar6 == 0) {
                  pbVar2 = (byte *)hrec->vals[lVar11];
                  bVar1 = *pbVar2;
                  if (bVar1 < 0x47) {
                    if (bVar1 == 0x2e) {
                      if (pbVar2[1] != 0) goto LAB_00114832;
                      local_58 = CONCAT44(local_58._4_4_,1);
                    }
                    else {
                      if ((bVar1 != 0x41) || (pbVar2[1] != 0)) {
LAB_00114832:
                        local_58 = (ulong)local_58._4_4_ << 0x20;
                        __isoc99_sscanf(pbVar2,"%d",&local_5c);
                        goto LAB_0011485f;
                      }
                      local_58 = CONCAT44(local_58._4_4_,2);
                    }
                  }
                  else if (bVar1 == 0x47) {
                    if (pbVar2[1] != 0) goto LAB_00114832;
                    local_58 = CONCAT44(local_58._4_4_,3);
                  }
                  else {
                    if ((bVar1 != 0x52) || (pbVar2[1] != 0)) goto LAB_00114832;
                    local_58 = CONCAT44(local_58._4_4_,4);
                  }
                  local_5c = 0xfffff;
                }
              }
            }
          }
LAB_0011485f:
          lVar11 = lVar11 + 1;
        } while (lVar11 < hrec->nkeys);
        if (local_40 == (char *)0x0) {
          return 0;
        }
        uVar12 = iVar5 << 4 | (int)local_58 << 8 | hrec->type | local_5c << 0xc;
        local_58 = (ulong)(uint)hrec->type;
        pcVar8 = strdup(local_40);
        pkVar3 = (kh_vdict_t *)local_38->dict[0];
        kVar7 = kh_put_vdict(pkVar3,pcVar8,&local_4c);
        iVar5 = (int)lVar13;
        if (local_4c == 0) {
          free(pcVar8);
          pbVar4 = pkVar3->vals;
          uVar9 = (uint)local_58 & 0xf;
          if (pbVar4[(int)kVar7].hrec[uVar9] != (bcf_hrec_t *)0x0) {
            return 0;
          }
          pbVar4[(int)kVar7].info[uVar9] = uVar12;
          pbVar4[(int)kVar7].hrec[uVar9] = hrec;
          if (iVar5 != -1) {
            return 1;
          }
          hrec_add_idx(hrec,pkVar3->vals[(int)kVar7].id);
          return 1;
        }
        pbVar4 = pkVar3->vals;
        pbVar4[(int)kVar7].hrec[2] = (bcf_hrec_t *)0x0;
        (pbVar4[(int)kVar7].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
        pbVar4[(int)kVar7].hrec[0] = (bcf_hrec_t *)0x0;
        pbVar4[(int)kVar7].hrec[1] = (bcf_hrec_t *)0x0;
        pbVar4 = pbVar4 + (int)kVar7;
        pbVar4->info[0] = 0xf;
        pbVar4->info[1] = 0xf;
        *(undefined8 *)(pbVar4->info + 2) = 0xf;
        pbVar4 = pkVar3->vals;
        uVar9 = (uint)local_58 & 0xf;
        pbVar4[(int)kVar7].info[uVar9] = uVar12;
        pbVar4[(int)kVar7].hrec[uVar9] = hrec;
        if (iVar5 == -1) {
          iVar5 = pkVar3->size - 1;
          pkVar3->vals[(int)kVar7].id = iVar5;
          hrec_add_idx(hrec,iVar5);
        }
        else {
          pkVar3->vals[(int)kVar7].id = iVar5;
        }
        goto LAB_00114a45;
      }
    }
    else {
      iVar5 = strcmp(pcVar8,"FILTER");
      if (iVar5 == 0) {
        iVar5 = 0;
        goto LAB_00114657;
      }
      iVar5 = strcmp(pcVar8,"FORMAT");
      if (iVar5 == 0) {
        iVar5 = 2;
        goto LAB_00114657;
      }
      if (0 < hrec->nkeys) {
        hrec->type = 4;
        goto LAB_00114a45;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int bcf_hdr_register_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    // contig
    int i,j,k, ret;
    char *str;
    if ( !strcmp(hrec->key, "contig") )
    {
        hrec->type = BCF_HL_CTG;

        // Get the contig ID ($str) and length ($j)
        i = bcf_hrec_find_key(hrec,"length");
        if ( i<0 ) j = 0;
        else if ( sscanf(hrec->vals[i],"%d",&j)!=1 ) return 0;

        i = bcf_hrec_find_key(hrec,"ID");
        if ( i<0 ) return 0;
        str = strdup(hrec->vals[i]);

        // Register in the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_CTG];
        k = kh_put(vdict, d, str, &ret);
        if ( !ret ) { free(str); return 0; }    // already present

        int idx = bcf_hrec_find_key(hrec,"IDX");
        if ( idx!=-1 )
        {
            char *tmp = hrec->vals[idx];
            idx = strtol(hrec->vals[idx], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else
        {
            idx = kh_size(d) - 1;
            hrec_add_idx(hrec, idx);
        }

        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = idx;
        kh_val(d, k).info[0] = j;
        kh_val(d, k).hrec[0] = hrec;

        return 1;
    }

    if ( !strcmp(hrec->key, "INFO") ) hrec->type = BCF_HL_INFO;
    else if ( !strcmp(hrec->key, "FILTER") ) hrec->type = BCF_HL_FLT;
    else if ( !strcmp(hrec->key, "FORMAT") ) hrec->type = BCF_HL_FMT;
    else if ( hrec->nkeys>0 ) { hrec->type = BCF_HL_STR; return 1; }
    else return 0;

    // INFO/FILTER/FORMAT
    char *id = NULL;
    int type = -1, num = -1, var = -1, idx = -1;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( !strcmp(hrec->keys[i], "ID") ) id = hrec->vals[i];
        else if ( !strcmp(hrec->keys[i], "IDX") )
        {
            char *tmp = hrec->vals[i];
            idx = strtol(hrec->vals[i], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Type") )
        {
            if ( !strcmp(hrec->vals[i], "Integer") ) type = BCF_HT_INT;
            else if ( !strcmp(hrec->vals[i], "Float") ) type = BCF_HT_REAL;
            else if ( !strcmp(hrec->vals[i], "String") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Character") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Flag") ) type = BCF_HT_FLAG;
            else
            {
                fprintf(stderr, "[E::%s] The type \"%s\" not supported, assuming \"String\"\n", __func__, hrec->vals[i]);
                type = BCF_HT_STR;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Number") )
        {
            if ( !strcmp(hrec->vals[i],"A") ) var = BCF_VL_A;
            else if ( !strcmp(hrec->vals[i],"R") ) var = BCF_VL_R;
            else if ( !strcmp(hrec->vals[i],"G") ) var = BCF_VL_G;
            else if ( !strcmp(hrec->vals[i],".") ) var = BCF_VL_VAR;
            else
            {
                sscanf(hrec->vals[i],"%d",&num);
                var = BCF_VL_FIXED;
            }
            if (var != BCF_VL_FIXED) num = 0xfffff;
        }
    }
    uint32_t info = (uint32_t)num<<12 | var<<8 | type<<4 | hrec->type;

    if ( !id ) return 0;
    str = strdup(id);

    vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_ID];
    k = kh_put(vdict, d, str, &ret);
    if ( !ret )
    {
        // already present
        free(str);
        if ( kh_val(d, k).hrec[info&0xf] ) return 0;
        kh_val(d, k).info[info&0xf] = info;
        kh_val(d, k).hrec[info&0xf] = hrec;
        if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);
        return 1;
    }
    kh_val(d, k) = bcf_idinfo_def;
    kh_val(d, k).info[info&0xf] = info;
    kh_val(d, k).hrec[info&0xf] = hrec;
    kh_val(d, k).id = idx==-1 ? kh_size(d) - 1 : idx;

    if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);

    return 1;
}